

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::AccessorPrimitiveFieldGenerator::
AccessorPrimitiveFieldGenerator
          (AccessorPrimitiveFieldGenerator *this,FieldDescriptor *descriptor,Params *params,
          int has_bit_index)

{
  Params *descriptor_00;
  allocator<char> local_141;
  string local_140;
  Params local_110;
  int local_24;
  Params *pPStack_20;
  int has_bit_index_local;
  Params *params_local;
  FieldDescriptor *descriptor_local;
  AccessorPrimitiveFieldGenerator *this_local;
  
  local_24 = has_bit_index;
  pPStack_20 = params;
  params_local = (Params *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,params);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__AccessorPrimitiveFieldGenerator_006f9558;
  this->descriptor_ = (FieldDescriptor *)params_local;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  descriptor_00 = params_local;
  Params::Params(&local_110,pPStack_20);
  anon_unknown_5::SetPrimitiveVariables
            ((FieldDescriptor *)descriptor_00,&local_110,&this->variables_);
  Params::~Params(&local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"has",&local_141);
  SetBitOperationVariables(&local_140,local_24,&this->variables_);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

AccessorPrimitiveFieldGenerator::
AccessorPrimitiveFieldGenerator(const FieldDescriptor* descriptor,
     const Params& params, int has_bit_index)
  : FieldGenerator(params), descriptor_(descriptor) {
  SetPrimitiveVariables(descriptor, params, &variables_);
  SetBitOperationVariables("has", has_bit_index, &variables_);
}